

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O0

CURLcode ntlm_decode_type2_target(Curl_easy *data,bufref *type2ref,ntlmdata *ntlm)

{
  uint uVar1;
  uchar *puVar2;
  size_t sVar3;
  void *pvVar4;
  size_t type2len;
  uchar *type2;
  uint target_info_offset;
  unsigned_short target_info_len;
  ntlmdata *ntlm_local;
  bufref *type2ref_local;
  Curl_easy *data_local;
  
  type2._6_2_ = 0;
  puVar2 = Curl_bufref_ptr(type2ref);
  sVar3 = Curl_bufref_len(type2ref);
  if (0x2f < sVar3) {
    type2._6_2_ = Curl_read16_le(puVar2 + 0x28);
    uVar1 = Curl_read32_le(puVar2 + 0x2c);
    if (type2._6_2_ != 0) {
      if (((sVar3 < uVar1) || (sVar3 < uVar1 + type2._6_2_)) || (uVar1 < 0x30)) {
        Curl_infof(data,
                   "NTLM handshake failure (bad type-2 message). Target Info Offset Len is set incorrect by the peer"
                  );
        return CURLE_BAD_CONTENT_ENCODING;
      }
      (*Curl_cfree)(ntlm->target_info);
      pvVar4 = (*Curl_cmalloc)((size_t)type2._6_2_);
      ntlm->target_info = pvVar4;
      if (ntlm->target_info == (void *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(ntlm->target_info,puVar2 + uVar1,(ulong)type2._6_2_);
    }
  }
  ntlm->target_info_len = (uint)type2._6_2_;
  return CURLE_OK;
}

Assistant:

static CURLcode ntlm_decode_type2_target(struct Curl_easy *data,
                                         const struct bufref *type2ref,
                                         struct ntlmdata *ntlm)
{
  unsigned short target_info_len = 0;
  unsigned int target_info_offset = 0;
  const unsigned char *type2 = Curl_bufref_ptr(type2ref);
  size_t type2len = Curl_bufref_len(type2ref);

#if defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void) data;
#endif

  if(type2len >= 48) {
    target_info_len = Curl_read16_le(&type2[40]);
    target_info_offset = Curl_read32_le(&type2[44]);
    if(target_info_len > 0) {
      if((target_info_offset > type2len) ||
         (target_info_offset + target_info_len) > type2len ||
         target_info_offset < 48) {
        infof(data, "NTLM handshake failure (bad type-2 message). "
              "Target Info Offset Len is set incorrect by the peer");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      free(ntlm->target_info); /* replace any previous data */
      ntlm->target_info = malloc(target_info_len);
      if(!ntlm->target_info)
        return CURLE_OUT_OF_MEMORY;

      memcpy(ntlm->target_info, &type2[target_info_offset], target_info_len);
    }
  }

  ntlm->target_info_len = target_info_len;

  return CURLE_OK;
}